

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c6280_mame.c
# Opt level: O2

UINT8 device_start_c6280_mame(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  DEV_DATA chip;
  long lVar2;
  UINT8 UVar3;
  uint uVar4;
  double dVar5;
  
  uVar1 = cfg->clock;
  uVar4 = uVar1 >> 4;
  if (cfg->srMode == '\x02') {
    if (uVar4 <= cfg->smplRate) {
      uVar4 = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    uVar4 = cfg->smplRate;
  }
  chip.chipInf = calloc(1,0x4290);
  if ((DEV_DATA *)chip.chipInf == (DEV_DATA *)0x0) {
    UVar3 = 0xff;
  }
  else {
    dVar5 = (double)uVar1 / (double)uVar4;
    for (uVar1 = 1; uVar1 != 0x1001; uVar1 = uVar1 + 1) {
      *(int *)((long)chip.chipInf + (ulong)(uVar1 & 0xfff) * 4 + 0x28c) =
           (int)(long)((dVar5 * 4096.0) / (double)(int)uVar1);
    }
    for (lVar2 = 0x83; lVar2 != 0xa3; lVar2 = lVar2 + 1) {
      *(int *)((long)chip.chipInf + lVar2 * 4) =
           (int)(long)((dVar5 * 32.0) / (double)((int)lVar2 + -0x82));
    }
    dVar5 = 341.3333333333333;
    for (lVar2 = 0xe6; lVar2 != 0x105; lVar2 = lVar2 + 1) {
      *(short *)((long)chip.chipInf + lVar2 * 2) = (short)(int)dVar5;
      dVar5 = dVar5 / 1.1885022274370185;
    }
    *(undefined2 *)((long)chip.chipInf + 0x20a) = 0;
    UVar3 = '\0';
    c6280mame_set_mute_mask(chip.chipInf,0);
    *(void **)chip.chipInf = chip.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)chip.chipInf;
    retDevInf->sampleRate = uVar4;
    retDevInf->devDef = &devDef_C6280_MAME;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_c6280_mame(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 16;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = device_start_c6280mame(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_C6280_MAME);
	return 0x00;
}